

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void csrPrintDense(char *s,CUPDLPcsr *csr)

{
  cupdlp_int *pcVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  
  puts("------------------------------------------------");
  printf("%s:\n",s);
  lVar2 = 0;
  while (lVar2 < csr->nRows) {
    pcVar1 = csr->rowMatBeg;
    for (lVar3 = (long)pcVar1[lVar2]; lVar3 < pcVar1[lVar2 + 1]; lVar3 = lVar3 + 1) {
      iVar4 = csr->rowMatIdx[lVar3];
      if (pcVar1[lVar2] != (int)lVar3) {
        iVar4 = iVar4 + ~csr->rowMatIdx[lVar3 + -1];
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        printf("       ");
      }
      printf("%6.3f ",csr->rowMatElem[lVar3]);
      pcVar1 = csr->rowMatBeg;
    }
    putchar(10);
    lVar2 = lVar2 + 1;
  }
  puts("------------------------------------------------");
  return;
}

Assistant:

void csrPrintDense(const char *s, CUPDLPcsr *csr) {
  cupdlp_printf("------------------------------------------------\n");
  cupdlp_printf("%s:\n", s);
  cupdlp_int deltaCol = 0;
  for (cupdlp_int iRow = 0; iRow < csr->nRows; ++iRow) {
    for (cupdlp_int iElem = csr->rowMatBeg[iRow];
         iElem < csr->rowMatBeg[iRow + 1]; ++iElem) {
      if (iElem == csr->rowMatBeg[iRow])
        deltaCol = csr->rowMatIdx[iElem];
      else
        deltaCol = csr->rowMatIdx[iElem] - csr->rowMatIdx[iElem - 1] - 1;
      for (cupdlp_int i = 0; i < deltaCol; ++i) {
        cupdlp_printf("       ");
      }
      cupdlp_printf("%6.3f ", csr->rowMatElem[iElem]);
    }
    cupdlp_printf("\n");
  }
  cupdlp_printf("------------------------------------------------\n");
}